

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamespaceScope.cpp
# Opt level: O1

uint __thiscall xercesc_4_0::NamespaceScope::increaseDepth(NamespaceScope *this)

{
  uint uVar1;
  StackElem *pSVar2;
  
  if (this->fStackTop == this->fStackCapacity) {
    expandStack(this);
  }
  if (this->fStack[this->fStackTop] == (StackElem *)0x0) {
    pSVar2 = (StackElem *)XMemory::operator_new(0x10,this->fMemoryManager);
    uVar1 = this->fStackTop;
    this->fStack[uVar1] = pSVar2;
    pSVar2 = this->fStack[uVar1];
    pSVar2->fMapCapacity = 0;
    pSVar2->fMap = (PrefMapElem *)0x0;
  }
  uVar1 = this->fStackTop;
  this->fStack[uVar1]->fMapCount = 0;
  this->fStackTop = uVar1 + 1;
  return uVar1;
}

Assistant:

unsigned int NamespaceScope::increaseDepth()
{
    // See if we need to expand the stack
    if (fStackTop == fStackCapacity)
        expandStack();

    // If this element has not been initialized yet, then initialize it
    if (!fStack[fStackTop])
    {
        fStack[fStackTop] = new (fMemoryManager) StackElem;
        fStack[fStackTop]->fMapCapacity = 0;
        fStack[fStackTop]->fMap = 0;
    }

    // Set up the new top row
    fStack[fStackTop]->fMapCount = 0;

    // Bump the top of stack
    fStackTop++;

    return fStackTop-1;
}